

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeinApi.c
# Opt level: O2

int skeinFinal(SkeinCtx_t *ctx,uint8_t *hash)

{
  u64b_t uVar1;
  int iVar2;
  
  if (ctx != (SkeinCtx_t *)0x0) {
    uVar1 = ctx->skeinSize;
    if (uVar1 == 0x400) {
      iVar2 = Skein1024_Final(&(ctx->m).s1024,hash);
      return iVar2;
    }
    if (uVar1 == 0x200) {
      iVar2 = Skein_512_Final(&(ctx->m).s512,hash);
      return iVar2;
    }
    if (uVar1 == 0x100) {
      iVar2 = Skein_256_Final(&(ctx->m).s256,hash);
      return iVar2;
    }
  }
  return 1;
}

Assistant:

int skeinFinal(SkeinCtx_t* ctx, uint8_t* hash)
{
    int ret = SKEIN_FAIL;
    Skein_Assert(ctx, SKEIN_FAIL);

    switch (ctx->skeinSize) {
    case Skein256:
        ret = Skein_256_Final(&ctx->m.s256, (u08b_t*)hash);
        break;
    case Skein512:
        ret = Skein_512_Final(&ctx->m.s512, (u08b_t*)hash);
        break;
    case Skein1024:
        ret = Skein1024_Final(&ctx->m.s1024, (u08b_t*)hash);
        break;
    }
    return ret;
}